

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpack.c
# Opt level: O0

int lws_add_http2_header_by_name(lws *wsi,uchar *name,uchar *value,int length,uchar **p,uchar *end)

{
  uchar *puVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  size_t local_60;
  uint local_44;
  int len;
  uchar *end_local;
  uchar **p_local;
  int length_local;
  uchar *value_local;
  uchar *name_local;
  lws *wsi_local;
  
  if (length + 1U < (uint)((int)end - (int)*p)) {
    iVar2 = length + 1;
  }
  else {
    iVar2 = (int)end - (int)*p;
  }
  local_60 = (size_t)iVar2;
  lws_strncpy((char *)*p,(char *)value,local_60);
  _lws_log(0x40,"%s: %p  %s:%s (len %d)\n","lws_add_http2_header_by_name",*p,name,*p,length);
  sVar4 = strlen((char *)name);
  local_44 = (uint)sVar4;
  if ((local_44 != 0) && (name[(int)(local_44 - 1)] == ':')) {
    local_44 = local_44 - 1;
  }
  if (((*(ulong *)&wsi->field_0x46e >> 1 & 1) == 0) ||
     (iVar2 = strncmp((char *)name,"transfer-encoding",(ulong)local_44), iVar2 != 0)) {
    if ((long)end - (long)*p < (long)(int)(local_44 + length + 8)) {
      wsi_local._4_4_ = 1;
    }
    else {
      puVar1 = *p;
      *p = puVar1 + 1;
      *puVar1 = '\0';
      uVar3 = lws_h2_num_start(7,(long)(int)local_44);
      puVar1 = *p;
      *p = puVar1 + 1;
      *puVar1 = (uchar)uVar3;
      iVar2 = lws_h2_num(7,(long)(int)local_44,p,end);
      value_local = name;
      if (iVar2 == 0) {
        while (local_44 != 0) {
          iVar2 = tolower((uint)*value_local);
          puVar1 = *p;
          *p = puVar1 + 1;
          *puVar1 = (uchar)iVar2;
          local_44 = local_44 - 1;
          value_local = value_local + 1;
        }
        uVar3 = lws_h2_num_start(7,(long)length);
        puVar1 = *p;
        *p = puVar1 + 1;
        *puVar1 = (uchar)uVar3;
        iVar2 = lws_h2_num(7,(long)length,p,end);
        if (iVar2 == 0) {
          memcpy(*p,value,(ulong)(uint)length);
          *p = *p + length;
          wsi_local._4_4_ = 0;
        }
        else {
          wsi_local._4_4_ = 1;
        }
      }
      else {
        wsi_local._4_4_ = 1;
      }
    }
  }
  else {
    _lws_log(0x40,"rejecting %s\n",name);
    wsi_local._4_4_ = 0;
  }
  return wsi_local._4_4_;
}

Assistant:

int lws_add_http2_header_by_name(struct lws *wsi, const unsigned char *name,
				 const unsigned char *value, int length,
				 unsigned char **p, unsigned char *end)
{
	int len;

#if defined(_DEBUG)
	/* value does not have to be NUL-terminated... %.*s not available on
	 * all platforms */
	lws_strnncpy((char *)*p, (const char *)value, length,
			lws_ptr_diff(end, (*p)));

	lwsl_header("%s: %p  %s:%s (len %d)\n", __func__, *p, name,
			(const char *)*p, length);
#endif

	len = (int)strlen((char *)name);
	if (len)
		if (name[len - 1] == ':')
			len--;

	if (wsi->mux_substream && !strncmp((const char *)name,
					     "transfer-encoding", (unsigned int)len)) {
		lwsl_header("rejecting %s\n", name);

		return 0;
	}

	if (end - *p < len + length + 8)
		return 1;

	*((*p)++) = 0; /* literal hdr, literal name,  */

	*((*p)++) = (uint8_t)(0 | (uint8_t)lws_h2_num_start(7, (unsigned long)len)); /* non-HUF */
	if (lws_h2_num(7, (unsigned long)len, p, end))
		return 1;

	/* upper-case header names are verboten in h2, but OK on h1, so
	 * they're not illegal per se.  Silently convert them for h2... */

	while(len--)
		*((*p)++) = (uint8_t)tolower((int)*name++);

	*((*p)++) = (uint8_t)(0 | (uint8_t)lws_h2_num_start(7, (unsigned long)length)); /* non-HUF */
	if (lws_h2_num(7, (unsigned long)length, p, end))
		return 1;

	memcpy(*p, value, (unsigned int)length);
	*p += length;

	return 0;
}